

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O0

string * __thiscall
soul::CompileMessage::getSeverity_abi_cxx11_(string *__return_storage_ptr__,CompileMessage *this)

{
  bool bVar1;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  CompileMessage *local_18;
  CompileMessage *this_local;
  
  local_18 = this;
  this_local = (CompileMessage *)__return_storage_ptr__;
  bVar1 = isError(this);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"error",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    bVar1 = isWarning(this);
    if (!bVar1) {
      throwInternalCompilerError("getSeverity",0x53);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"warning",local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompileMessage::getSeverity() const
{
    if (isError())    return "error";
    if (isWarning())  return "warning";

    SOUL_ASSERT_FALSE;
    return {};
}